

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints.cc
# Opt level: O0

bool __thiscall
bssl::NameConstraints::IsPermittedDirectoryName(NameConstraints *this,Input name_rdn_sequence)

{
  bool bVar1;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *pvVar2;
  Span<const_unsigned_char> *pSVar3;
  Input *permitted_name;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *__range1_1;
  Input *excluded_name;
  const_iterator __end1;
  const_iterator __begin1;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *__range1;
  NameConstraints *this_local;
  Input name_rdn_sequence_local;
  
  pvVar2 = &(this->excluded_subtrees_).directory_names;
  __end1 = ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::begin(pvVar2);
  excluded_name =
       (Input *)::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
                                *)&excluded_name);
    if (!bVar1) {
      if (((this->permitted_subtrees_).present_name_types & 0x10U) == 0) {
        name_rdn_sequence_local.data_.size_._7_1_ = true;
      }
      else {
        pvVar2 = &(this->permitted_subtrees_).directory_names;
        __end1_1 = ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::begin(pvVar2)
        ;
        permitted_name =
             (Input *)::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::end
                                (pvVar2);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end1_1,
                                  (__normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
                                   *)&permitted_name), bVar1) {
          pSVar3 = &__gnu_cxx::
                    __normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
                    ::operator*(&__end1_1)->data_;
          bVar1 = VerifyNameInSubtree(name_rdn_sequence,(Input)*pSVar3);
          if (bVar1) {
            return true;
          }
          __gnu_cxx::
          __normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
          ::operator++(&__end1_1);
        }
        name_rdn_sequence_local.data_.size_._7_1_ = false;
      }
      return name_rdn_sequence_local.data_.size_._7_1_;
    }
    pSVar3 = &__gnu_cxx::
              __normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
              ::operator*(&__end1)->data_;
    bVar1 = VerifyNameInSubtree(name_rdn_sequence,(Input)*pSVar3);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
    ::operator++(&__end1);
  }
  return false;
}

Assistant:

bool NameConstraints::IsPermittedDirectoryName(
    der::Input name_rdn_sequence) const {
  for (const auto &excluded_name : excluded_subtrees_.directory_names) {
    if (VerifyNameInSubtree(name_rdn_sequence, excluded_name)) {
      return false;
    }
  }

  // If permitted subtrees are not constrained, any name that is not excluded is
  // allowed.
  if (!(permitted_subtrees_.present_name_types & GENERAL_NAME_DIRECTORY_NAME)) {
    return true;
  }

  for (const auto &permitted_name : permitted_subtrees_.directory_names) {
    if (VerifyNameInSubtree(name_rdn_sequence, permitted_name)) {
      return true;
    }
  }

  return false;
}